

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O0

BitArray * ZXing::Aztec::ToBitArray(EncodingState *state,string *text)

{
  bool bVar1;
  iterator this;
  reference bitArray;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Token *symbol;
  iterator __end2;
  iterator __begin2;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *__range2;
  EncodingState endState;
  BitArray *bits;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff90;
  __normal_iterator<ZXing::Aztec::Token_*,_std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>_>
  local_58;
  undefined8 in_stack_ffffffffffffffb0;
  int index;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  
  index = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  Size<std::__cxx11::string>(in_RDI);
  EndBinaryShift((EncodingState *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                 index);
  BitArray::BitArray((BitArray *)0x264c76);
  local_58._M_current =
       (Token *)std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::begin
                          (in_stack_ffffffffffffff68);
  this = std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::end
                   (in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<ZXing::Aztec::Token_*,_std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>_>
                             *)in_RDI,
                            (__normal_iterator<ZXing::Aztec::Token_*,_std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>_>
                             *)in_stack_ffffffffffffff68), bVar1) {
    bitArray = __gnu_cxx::
               __normal_iterator<ZXing::Aztec::Token_*,_std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>_>
               ::operator*(&local_58);
    Token::appendTo(this._M_current,(BitArray *)bitArray,in_stack_ffffffffffffff90);
    __gnu_cxx::
    __normal_iterator<ZXing::Aztec::Token_*,_std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>_>
    ::operator++(&local_58);
  }
  EncodingState::~EncodingState((EncodingState *)0x264d2d);
  return (BitArray *)in_RDI;
}

Assistant:

static BitArray ToBitArray(const EncodingState& state, const std::string& text)
{
	auto endState = EndBinaryShift(state, Size(text));
	BitArray bits;
	// Add each token to the result.
	for (const Token& symbol : endState.tokens) {
		symbol.appendTo(bits, text);
	}
	//assert bitArray.getSize() == this.bitCount;
	return bits;
}